

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

Buffer * ReadFile(Buffer *__return_storage_ptr__,char *filename)

{
  size_type __n;
  long *plVar1;
  runtime_error *prVar2;
  long *plVar3;
  ifstream file;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,filename,_S_in|_S_bin|_S_ate);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Failed to open file \"","")
    ;
    plVar1 = (long *)std::__cxx11::string::append((char *)local_278);
    local_258 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_258 == plVar3) {
      local_248 = *plVar3;
      lStack_240 = plVar1[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *plVar3;
    }
    local_250 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_298 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_298 == plVar3) {
      local_288 = *plVar3;
      lStack_280 = plVar1[3];
      local_298 = &local_288;
    }
    else {
      local_288 = *plVar3;
    }
    local_290 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::runtime_error::runtime_error(prVar2,(string *)&local_298);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n = std::istream::tellg();
  std::istream::seekg((long)local_238,_S_beg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_298);
  std::istream::read((char *)local_238,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 1) == 0) {
    std::ifstream::~ifstream(local_238);
    return __return_storage_ptr__;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Failed to read file.");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Buffer ReadFile(const char* filename) {
  std::ifstream file(filename, std::ios::binary | std::ios::in | std::ios::ate);
  if (!file) {
    throw Error(std::string("Failed to open file \"") + filename + "\".");
  }

  std::streamsize size = file.tellg();
  file.seekg(0, std::ios::beg);

  Buffer data(size);
  file.read(reinterpret_cast<char*>(data.data()), data.size());

  if (file.bad()) {
    throw Error("Failed to read file.");
  }

  return data;
}